

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktrade.cpp
# Opt level: O0

ostream * Kraken::operator<<(ostream *os,KTrade *kt)

{
  _Setprecision _Var1;
  ostream *poVar2;
  KTrade *kt_local;
  ostream *os_local;
  
  poVar2 = std::operator<<(os,'\"');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,kt->time);
  poVar2 = std::operator<<(poVar2,"\",\"");
  poVar2 = std::operator<<(poVar2,(char)kt->order);
  poVar2 = std::operator<<(poVar2,"\",\"");
  poVar2 = std::operator<<(poVar2,(char)kt->otype);
  poVar2 = std::operator<<(poVar2,"\",\"");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::fixed);
  _Var1 = std::setprecision(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,kt->price);
  poVar2 = std::operator<<(poVar2,"\",\"");
  _Var1 = std::setprecision(9);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,kt->volume);
  poVar2 = std::operator<<(poVar2,'\"');
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const KTrade& kt)
{
   return os << '"' << kt.time << "\",\""
	     << static_cast<char>(kt.order) << "\",\""
	     << static_cast<char>(kt.otype) << "\",\""
	     << std::fixed
	     << std::setprecision(5) << kt.price << "\",\""
	     << std::setprecision(9) << kt.volume << '"';
}